

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall icu_63::ReorderingBuffer::insert(ReorderingBuffer *this,UChar32 c,uint8_t cc)

{
  byte bVar1;
  UChar *pUVar2;
  int iVar3;
  UChar *pUVar4;
  UChar *local_28;
  UChar *r;
  UChar *q;
  uint8_t cc_local;
  UChar32 c_local;
  ReorderingBuffer *this_local;
  
  setIterator(this);
  skipPrevious(this);
  do {
    bVar1 = previousCC(this);
  } while (cc < bVar1);
  r = this->limit;
  iVar3 = 2;
  if ((uint)c < 0x10000) {
    iVar3 = 1;
  }
  pUVar2 = this->limit;
  this->limit = pUVar2 + iVar3;
  local_28 = pUVar2 + iVar3;
  do {
    pUVar2 = r + -1;
    pUVar4 = local_28 + -1;
    local_28[-1] = r[-1];
    local_28 = pUVar4;
    r = pUVar2;
  } while (this->codePointLimit != pUVar2);
  writeCodePoint(pUVar2,c);
  if (cc < 2) {
    this->reorderStart = pUVar4;
  }
  return;
}

Assistant:

void ReorderingBuffer::insert(UChar32 c, uint8_t cc) {
    for(setIterator(), skipPrevious(); previousCC()>cc;) {}
    // insert c at codePointLimit, after the character with prevCC<=cc
    UChar *q=limit;
    UChar *r=limit+=U16_LENGTH(c);
    do {
        *--r=*--q;
    } while(codePointLimit!=q);
    writeCodePoint(q, c);
    if(cc<=1) {
        reorderStart=r;
    }
}